

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

ssize_t http_decode_url(char *dest,char *url_data,size_t length)

{
  uint8_t *dest_00;
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  uint8_t *puVar4;
  
  puVar4 = (uint8_t *)(url_data + length);
  lVar3 = 0;
  do {
    if (puVar4 <= url_data) {
      dest[lVar3] = '\0';
      return lVar3;
    }
    dest_00 = (uint8_t *)(dest + lVar3);
    uVar1 = *url_data;
    if (uVar1 == '%') {
      iVar2 = hex2byte(dest_00,(uint8_t *)url_data + 1);
      if (iVar2 != 0) {
        return -1;
      }
      url_data = (char *)((uint8_t *)url_data + 3);
    }
    else if (uVar1 == '+') {
      *dest_00 = ' ';
      url_data = (char *)((uint8_t *)url_data + 1);
    }
    else {
      url_data = (char *)((uint8_t *)url_data + 1);
      *dest_00 = uVar1;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

ssize_t http_decode_url(char *dest, const char *url_data, size_t length) {
  char *pos = dest;
  const char *end = url_data + length;
  while (url_data < end) {
    if (*url_data == '+') {
      // decode space
      *(pos++) = ' ';
      ++url_data;
    } else if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}